

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O3

int get_one_number(dmr_C *C,int c,int next,stream_t *stream)

{
  char *__src;
  tokenizer_state_t *ptVar1;
  token *ptVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  ptVar1 = C->T;
  __src = ptVar1->number_buffer;
  pcVar6 = ptVar1->number_buffer + 1;
  ptVar1->number_buffer[0] = (char)c;
  uVar4 = C->T->cclass[next + 1];
  if ((uVar4 & 0x13) != 0) {
    pcVar3 = pcVar6;
    lVar7 = 0xeceb;
    do {
      lVar5 = 0xfce9;
      if (lVar7 != 0xfce9) {
        lVar5 = lVar7 + 1;
        *pcVar3 = (char)next;
      }
      next = nextchar(C,stream);
      if (((uVar4 & 8) != 0) && ((next == 0x2d || (next == 0x2b)))) {
        lVar7 = 0xfce9;
        if (lVar5 != 0xfce9) {
          ptVar1->special[lVar5 + -0x14] = (char)next;
          lVar7 = lVar5 + 1;
        }
        next = nextchar(C,stream);
        lVar5 = lVar7;
      }
      pcVar3 = ptVar1->special + lVar5 + -0x14;
      uVar4 = C->T->cclass[next + 1];
      lVar7 = lVar5;
    } while ((uVar4 & 0x13) != 0);
    if (lVar5 == 0xfce9) {
      dmrC_sparse_error(C,(position)
                          (CONCAT44(stream->line,
                                    (stream->whitespace & 1U) << 0x15 |
                                    (stream->nr & 0x3fffU) << 6 | (stream->newline & 1U) << 0x14 |
                                    stream->pos << 0x16) & 0x7fffffffffffffff),
                        "number token exceeds %td characters",0xfff);
      *__src = '1';
    }
    else {
      pcVar6 = ptVar1->special + lVar5 + -0x14;
    }
  }
  *pcVar6 = '\0';
  pcVar3 = (char *)dmrC_allocator_allocate(&C->byte_allocator,(size_t)(pcVar6 + (1 - (long)__src)));
  memcpy(pcVar3,__src,(size_t)(pcVar6 + (1 - (long)__src)));
  ptVar2 = stream->token;
  ptVar2->pos = (position)((ulong)ptVar2->pos & 0xffffffffffffffc0 | 4);
  (ptVar2->field_2).number = pcVar3;
  ptVar2 = stream->token;
  stream->token = (token *)0x0;
  ptVar2->next = (token *)0x0;
  *stream->tokenlist = ptVar2;
  stream->tokenlist = &ptVar2->next;
  return next;
}

Assistant:

static int get_one_number(struct dmr_C *C, int c, int next, stream_t *stream)
{
	struct token *token;
	char *buffer = C->T->number_buffer;
	char *p = buffer, *buf, *buffer_end = buffer + sizeof C->T->number_buffer;
	size_t len;

	*p++ = c;
	for (;;) {
		long kclass = C->T->cclass[next + 1];
		if (!(kclass & (Dot | Digit | Letter)))
			break;
		if (p != buffer_end)
			*p++ = next;
		next = nextchar(C, stream);
		if (kclass & Exp) {
			if (next == '-' || next == '+') {
				if (p != buffer_end)
					*p++ = next;
				next = nextchar(C, stream);
			}
		}
	}

	if (p == buffer_end) {
		dmrC_sparse_error(C, stream_pos(stream),
			     "number token exceeds %td characters",
			     buffer_end - buffer);
		// Pretend we saw just "1".
		buffer[0] = '1';
		p = buffer + 1;
	}

	*p++ = 0;
	len = p - buffer;
	buf = (char *)dmrC_allocator_allocate(&C->byte_allocator, len);
	memcpy(buf, buffer, len);

	token = stream->token;
	dmrC_token_type(token) = TOKEN_NUMBER;
	token->number = buf;
	add_token(stream);

	return next;
}